

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * MyGame_Example_notemptyenum_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  char *pcVar1;
  
  if ((ulong)((long)end - (long)buf) < 8) {
    bVar2 = 0;
    bVar3 = 0;
    bVar4 = 0;
    bVar5 = 0;
    bVar6 = 0;
    bVar7 = 0;
    switch((long)end - (long)buf) {
    case 7:
      bVar2 = buf[6] >> 7;
    case 6:
      bVar3 = bVar2 | buf[5] >> 7;
    case 5:
      bVar4 = bVar3 | buf[4] >> 7;
    case 4:
      bVar5 = bVar4 | buf[3] >> 7;
    case 3:
      bVar6 = bVar5 | buf[2] >> 7;
    case 2:
      bVar7 = bVar6 | buf[1] >> 7;
    case 1:
      bVar7 = *buf | bVar7;
      break;
    default:
      goto switchD_00113c2a_default;
    }
  }
  else {
    bVar7 = (byte)*(undefined8 *)buf;
  }
  if ((bVar7 == 0x78) &&
     (pcVar1 = flatcc_json_parser_match_constant(ctx,buf,end,1,aggregate), pcVar1 != buf)) {
    *value = 0;
    *value_sign = 0;
    buf = pcVar1;
  }
switchD_00113c2a_default:
  return buf;
}

Assistant:

static const char *MyGame_Example_notemptyenum_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if ((w & 0xff00000000000000) == 0x7800000000000000) { /* "x" */
        buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 1, aggregate);
        if (buf != mark) {
            *value = UINT64_C(0), *value_sign = 0;
        } else {
            return unmatched;
        }
    } else { /* "x" */
        return unmatched;
    } /* "x" */
    return buf;
}